

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs-poll.c
# Opt level: O1

int uv_fs_poll_stop(uv_fs_poll_t *handle)

{
  uint *puVar1;
  uint uVar2;
  long *plVar3;
  
  if ((handle->flags & 4) != 0) {
    plVar3 = (long *)handle->poll_ctx;
    if (plVar3 == (long *)0x0) {
      __assert_fail("ctx != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/fs-poll.c"
                    ,0x6f,"int uv_fs_poll_stop(uv_fs_poll_t *)");
    }
    if (*plVar3 == 0) {
      __assert_fail("ctx->parent_handle != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/fs-poll.c"
                    ,0x70,"int uv_fs_poll_stop(uv_fs_poll_t *)");
    }
    *plVar3 = 0;
    handle->poll_ctx = (void *)0x0;
    if ((*(byte *)(plVar3 + 0x10) & 4) != 0) {
      uv_close((uv_handle_t *)(plVar3 + 5),timer_close_cb);
    }
    uVar2 = handle->flags;
    if (((uVar2 & 4) != 0) && (handle->flags = uVar2 & 0xfffffffb, (uVar2 & 8) != 0)) {
      puVar1 = &handle->loop->active_handles;
      *puVar1 = *puVar1 - 1;
    }
  }
  return 0;
}

Assistant:

int uv_fs_poll_stop(uv_fs_poll_t* handle) {
  struct poll_ctx* ctx;

  if (!uv__is_active(handle))
    return 0;

  ctx = handle->poll_ctx;
  assert(ctx != NULL);
  assert(ctx->parent_handle != NULL);
  ctx->parent_handle = NULL;
  handle->poll_ctx = NULL;

  /* Close the timer if it's active. If it's inactive, there's a stat request
   * in progress and poll_cb will take care of the cleanup.
   */
  if (uv__is_active(&ctx->timer_handle))
    uv_close((uv_handle_t*)&ctx->timer_handle, timer_close_cb);

  uv__handle_stop(handle);

  return 0;
}